

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppConfig.h
# Opt level: O3

void __thiscall
ConfigManager::Configurations::AppConfig::SetConfigurationMap
          (AppConfig *this,
          map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *configs)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree<ConfigManager::Enums::Configurations,_std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_38;
  
  std::
  _Rb_tree<ConfigManager::Enums::Configurations,_std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&_Stack_38,&configs->_M_t);
  std::
  _Rb_tree<ConfigManager::Enums::Configurations,_std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->
           super_IConfigurationMap<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).m_configs._M_t);
  if (_Stack_38._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &_Stack_38._M_impl.super__Rb_tree_header;
    (this->
    super_IConfigurationMap<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).m_configs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _Stack_38._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->
    super_IConfigurationMap<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).m_configs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         _Stack_38._M_impl.super__Rb_tree_header._M_header._M_parent;
    (this->
    super_IConfigurationMap<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).m_configs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         _Stack_38._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->
    super_IConfigurationMap<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).m_configs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_38._M_impl.super__Rb_tree_header._M_header._M_right;
    (_Stack_38._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(this->
          super_IConfigurationMap<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).m_configs._M_t._M_impl.super__Rb_tree_header._M_header;
    (this->
    super_IConfigurationMap<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).m_configs._M_t._M_impl.super__Rb_tree_header._M_node_count =
         _Stack_38._M_impl.super__Rb_tree_header._M_node_count;
    _Stack_38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_38._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_38._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    _Stack_38._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::
  _Rb_tree<ConfigManager::Enums::Configurations,_std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&_Stack_38);
  return;
}

Assistant:

void SetConfigurationMap(std::map<Enums::Configurations, std::string> configs) noexcept override
        {
            m_configs = std::map(configs);
        }